

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void shared_container_free(shared_container_t *container)

{
  uint32_t uVar1;
  
  if (container->counter == 0) {
    __assert_fail("container->counter > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x2d49,"void shared_container_free(shared_container_t *)");
  }
  uVar1 = container->counter - 1;
  container->counter = uVar1;
  if (uVar1 != 0) {
    return;
  }
  if (container->typecode != '\x04') {
    container_free(container->container,container->typecode);
    free(container);
    return;
  }
  __assert_fail("container->typecode != SHARED_CONTAINER_TYPE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x2d4c,"void shared_container_free(shared_container_t *)");
}

Assistant:

void shared_container_free(shared_container_t *container) {
    assert(container->counter > 0);
    container->counter--;
    if (container->counter == 0) {
        assert(container->typecode != SHARED_CONTAINER_TYPE);
        container_free(container->container, container->typecode);
        container->container = NULL;  // paranoid
        free(container);
    }
}